

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getenv_s.c
# Opt level: O1

int main(void)

{
  errno_t eVar1;
  int iVar2;
  size_t len;
  char value [100];
  undefined8 local_80;
  char local_78 [104];
  
  set_constraint_handler_s(test_handler);
  eVar1 = getenv_s(&local_80,local_78,100,"SHELL");
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdlib/getenv_s.c, line %d - %s\n"
           ,0x5c,"getenv_s( &len, value, 100, \"SHELL\" ) == 0");
  }
  iVar2 = strcmp(local_78 + (local_80 - 2),"sh");
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdlib/getenv_s.c, line %d - %s\n"
           ,0x5d,"strcmp( value + ( len - 2 ), \"sh\" ) == 0");
  }
  (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  eVar1 = getenv_s(&local_80,local_78,100,"supercalifragilisticexpialidocius");
  if (eVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdlib/getenv_s.c, line %d - %s\n"
           ,0x67,"getenv_s( &len, value, 100, \"supercalifragilisticexpialidocius\" ) != 0");
  }
  if (HANDLER_CALLS != 4) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdlib/getenv_s.c, line %d - %s\n"
           ,0x69,"HANDLER_CALLS == 4");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    size_t len;
    char value[100];
    set_constraint_handler_s( test_handler );

    TESTCASE( getenv_s( &len, value, 100, "SHELL" ) == 0 );
    TESTCASE( strcmp( value + ( len - 2 ), "sh" ) == 0 );
    /* TESTCASE( strcmp( value, "/bin/sh" ) == 0 ); */

    /* constraint violations */
    TESTCASE( getenv_s( &len, NULL, 100, "SHELL" ) != 0 );
    TESTCASE( getenv_s( &len, value, 0, "SHELL" ) != 0 );
    TESTCASE( getenv_s( &len, value, RSIZE_MAX + 1, "SHELL" ) != 0 );
    TESTCASE( getenv_s( &len, value, 100, NULL ) != 0 );

    /* non-existing (hopefully), != 0 but not constraint violation */
    TESTCASE( getenv_s( &len, value, 100, "supercalifragilisticexpialidocius" ) != 0 );

    TESTCASE( HANDLER_CALLS == 4 );
#endif
    return TEST_RESULTS;
}